

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall tcu::CaseTreeNode::addChild(CaseTreeNode *this,CaseTreeNode *child)

{
  pointer *pppCVar1;
  iterator __position;
  CaseTreeNode *local_8;
  
  __position._M_current =
       (this->m_children).
       super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = child;
    std::vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>>::
    _M_realloc_insert<tcu::CaseTreeNode*const&>
              ((vector<tcu::CaseTreeNode*,std::allocator<tcu::CaseTreeNode*>> *)&this->m_children,
               __position,&local_8);
  }
  else {
    *__position._M_current = child;
    pppCVar1 = &(this->m_children).
                super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void								addChild			(CaseTreeNode* child) { m_children.push_back(child); }